

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* doBuildInputVector(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                    *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *texts)

{
  pointer *ppvVar1;
  pointer *ppfVar2;
  ushort uVar3;
  iterator __position;
  long lVar4;
  pointer pvVar5;
  pointer pbVar6;
  pointer pcVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  pointer pvVar11;
  pointer pfVar12;
  iterator iVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> HSI;
  value_type words;
  undefined1 local_88 [16];
  pointer local_78;
  vector<float,_std::allocator<float>_> local_70;
  ulong local_50;
  double local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar11 = (images->
            super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pvVar11->
               super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
               )._M_impl.super__Vector_impl_data + 8) !=
      (pvVar11->
      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pfVar12 = (pointer)0x0;
    uVar16 = 0;
    local_40 = texts;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::_M_realloc_insert<>(__return_storage_ptr__,__position);
      }
      else {
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      pvVar11 = (images->
                super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((images->
          super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pvVar11) {
        uVar14 = 0;
        local_38 = pfVar12;
        do {
          uVar10 = 0;
          bVar9 = true;
          local_50 = uVar14;
          do {
            bVar15 = bVar9;
            lVar4 = *(long *)&(images->
                              super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data;
            lVar8 = (uVar10 | uVar16) * 3;
            uVar3 = *(ushort *)(lVar4 + lVar8);
            auVar17._0_4_ = (float)(uVar3 & 0xff);
            auVar17._4_4_ = (float)(byte)(uVar3 >> 8);
            auVar17._8_8_ = 0;
            auVar17 = divps(auVar17,_DAT_0015e010);
            local_88._0_8_ = auVar17._0_8_;
            local_88._8_4_ = (float)*(byte *)(lVar4 + 2 + lVar8) / 255.0;
            __l._M_len = 3;
            __l._M_array = (iterator)local_88;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_70,__l,(allocator_type *)&local_48);
            RGB2HSI((vector<float,_std::allocator<float>_> *)local_88,
                    *local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                    *(float *)((long)local_70.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 4),
                    *(float *)((long)local_70.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 8));
            pvVar5 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_48 = (double)*(float *)local_88._0_8_ / 6.283185307179586;
            iVar13._M_current =
                 pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<double>
                        (pvVar5 + -1,iVar13,&local_48);
            }
            else {
              *iVar13._M_current = (float)local_48;
              pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar13._M_current + 1;
            }
            pvVar5 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            iVar13._M_current =
                 pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                        ((vector<float,std::allocator<float>> *)(pvVar5 + -1),iVar13,
                         (float *)(local_88._0_8_ + 4));
            }
            else {
              *iVar13._M_current = *(float *)(local_88._0_8_ + 4);
              pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar13._M_current + 1;
            }
            pvVar5 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            iVar13._M_current =
                 pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                        ((vector<float,std::allocator<float>> *)(pvVar5 + -1),iVar13,
                         (float *)(local_88._0_8_ + 8));
              if ((float *)local_88._0_8_ != (float *)0x0) goto LAB_00109e3e;
            }
            else {
              *iVar13._M_current = *(float *)(local_88._0_8_ + 8);
              pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar13._M_current + 1;
LAB_00109e3e:
              operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
            }
            if ((pointer *)
                local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer *)0x0) {
              operator_delete(local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_70.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            uVar10 = 1;
            bVar9 = false;
          } while (bVar15);
          pbVar6 = (local_40->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppfVar2 = &local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pcVar7 = pbVar6[local_50]._M_dataplus._M_p;
          local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)ppfVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar7,pcVar7 + pbVar6[local_50]._M_string_length);
          pfVar12 = local_38;
          pvVar5 = (__return_storage_ptr__->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (local_38 <
              local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_88._0_4_ =
                 (float)(int)*(char *)((long)local_70.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                      (long)local_38) / 255.0;
            iVar13._M_current =
                 pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current ==
                pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (pvVar5 + -1,iVar13,(float *)local_88);
            }
            else {
              *iVar13._M_current = (float)local_88._0_4_;
LAB_00109efc:
              pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar13._M_current + 1;
            }
          }
          else {
            local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
            iVar13._M_current =
                 pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar13._M_current !=
                pvVar5[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar13._M_current = 0.0;
              goto LAB_00109efc;
            }
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<int>
                      (pvVar5 + -1,iVar13,(int *)local_88);
          }
          if ((pointer *)
              local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != ppfVar2) {
            operator_delete(local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 1);
          }
          uVar14 = local_50 + 1;
          pvVar11 = (images->
                    super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(images->
                          super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
                   -0x5555555555555555;
        } while (uVar14 <= uVar10 && uVar10 - uVar14 != 0);
      }
      uVar16 = uVar16 + 2;
      pfVar12 = (pointer)((long)pfVar12 + 1);
      uVar14 = ((long)(pvVar11->
                      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->
                     super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) * -0x5555555555555555;
    } while (uVar16 <= uVar14 && uVar14 - uVar16 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> doBuildInputVector(std::vector<BMPImage> &images, std::vector<std::string> &texts) {
    std::vector<std::vector<float>> input;
    for (int d = 0,t = 0; d < images[0].size(); d+=2, t++) {
        input.emplace_back();
        for (int i = 0; i < images.size(); i++) {
            for (int s = 0; s < 2; s++) {
                float r = images[i][d+s][0];
                float g = images[i][d+s][1];
                float b = images[i][d+s][2];
                auto rgbn = std::vector<float>({r/255, g/255, b/255});
                auto HSI = RGB2HSI(rgbn[0], rgbn[1], rgbn[2]);
                input.back().emplace_back(HSI[0]/(2*M_PI));
                input.back().emplace_back(HSI[1]);
                input.back().emplace_back(HSI[2]);
            }

            auto words = texts[i];
            if (t < words.size()) input.back().emplace_back(float(words[t])/255);
            else input.back().emplace_back(0);
        }
    }
    return input;
}